

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O2

Ptr<ImageView> __thiscall
myvk::ImageView::Create
          (ImageView *this,Ptr<ImageBase> *image,VkImageViewType view_type,VkFormat format,
          VkImageAspectFlags aspect_mask,uint32_t base_mip_level,uint32_t level_count,
          uint32_t base_array_layer,uint32_t layer_count,VkComponentMapping *components)

{
  Ptr<ImageView> PVar1;
  VkImageViewCreateInfo local_68;
  
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68._20_4_ = 0;
  local_68.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_68._4_4_ = 0;
  local_68.image =
       ((image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_image;
  local_68.format = format;
  local_68.viewType = view_type;
  local_68.subresourceRange.baseMipLevel = base_mip_level;
  local_68.subresourceRange.aspectMask = aspect_mask;
  local_68.subresourceRange.baseArrayLayer = base_array_layer;
  local_68.subresourceRange.levelCount = level_count;
  local_68._76_4_ = 0;
  local_68.subresourceRange.layerCount = layer_count;
  local_68.components.r = components->r;
  local_68.components.g = components->g;
  local_68.components.b = components->b;
  local_68.components.a = components->a;
  PVar1 = Create(this,image,&local_68);
  PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ImageView>)PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<ImageBase> &image, VkImageViewType view_type, VkFormat format,
                                 VkImageAspectFlags aspect_mask, uint32_t base_mip_level, uint32_t level_count,
                                 uint32_t base_array_layer, uint32_t layer_count,
                                 const VkComponentMapping &components) {
	VkImageViewCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
	create_info.image = image->GetHandle();
	create_info.viewType = view_type;
	create_info.format = format;
	create_info.subresourceRange.aspectMask = aspect_mask;
	create_info.subresourceRange.baseMipLevel = base_mip_level;
	create_info.subresourceRange.levelCount = level_count;
	create_info.subresourceRange.baseArrayLayer = base_array_layer;
	create_info.subresourceRange.layerCount = layer_count;
	create_info.components = components;

	return Create(image, create_info);
}